

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum.cpp
# Opt level: O0

string * __thiscall
pbrt::PiecewiseLinearSpectrum::ToString_abi_cxx11_(PiecewiseLinearSpectrum *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  PiecewiseLinearSpectrum *in_RDI;
  string local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  allocator<char> local_51;
  string local_50 [32];
  string local_30 [40];
  PiecewiseLinearSpectrum *this_00;
  
  this_00 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffa0,(char *)in_stack_ffffffffffffff98,
             (allocator<char> *)in_stack_ffffffffffffff90);
  ParameterString_abi_cxx11_(this_00);
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(in_RSI,(char *)in_RDI);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  return (string *)in_RDI;
}

Assistant:

std::string PiecewiseLinearSpectrum::ToString() const {
    return std::string("[ PiecewiseLinearSpectrum ") + ParameterString() + " ]";
}